

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void util::str_range(string *str,int *range_begin,int *range_end)

{
  int iVar1;
  int iVar2;
  long lVar3;
  exception *this;
  char (*in_R8) [2];
  string sStack_48;
  
  lVar3 = std::__cxx11::string::rfind((char)str,0x2d);
  if ((lVar3 == -1) && (lVar3 = std::__cxx11::string::rfind((char)str,0x2c), lVar3 == -1)) {
    *range_begin = 0;
    iVar1 = str_value<int>(str);
    *range_end = iVar1;
    return;
  }
  std::__cxx11::string::substr((ulong)&sStack_48,(ulong)str);
  iVar1 = str_value<int>(&sStack_48);
  *range_begin = iVar1;
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::substr((ulong)&sStack_48,(ulong)str);
  iVar1 = str_value<int>(&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if ((str->_M_dataplus)._M_p[lVar3] == '-') {
    iVar2 = 1;
  }
  else {
    iVar2 = *range_begin;
  }
  *range_end = iVar2 + iVar1;
  if (*range_begin < iVar2 + iVar1) {
    return;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
            (&sStack_48,(util *)"invalid range \'",(char *)str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1aace7,in_R8);
  exception::exception<std::__cxx11::string>(this,&sStack_48);
  __cxa_throw(this,&exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void str_range(const std::string& str, int& range_begin, int& range_end)
{
    auto idx = str.rfind('-');
    if (idx == str.npos)
        idx = str.rfind(',');

    try
    {
        if (idx == str.npos)
        {
            range_begin = 0;
            range_end = str_value<int>(str);
            return;
        }

        range_begin = str_value<int>(str.substr(0, idx));
        auto value2 = str_value<int>(str.substr(idx + 1));

        if (str[idx] == '-')
            range_end = value2 + 1;
        else
            range_end = range_begin + value2;

        if (range_end > range_begin)
            return;
    }
    catch (...)
    {
    }

    throw util::exception(util::format("invalid range '", str, "'"));
}